

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void __thiscall ImGuiIO::ClearInputKeys(ImGuiIO *this)

{
  int local_18;
  int local_14;
  int n_1;
  int n;
  ImGuiIO_conflict *this_local;
  
  memset(this->KeysDown,0,0x200);
  for (local_14 = 0; local_14 < 0x200; local_14 = local_14 + 1) {
    this->KeysDownDurationPrev[local_14] = -1.0;
    this->KeysDownDuration[local_14] = -1.0;
  }
  this->KeySuper = false;
  this->KeyAlt = false;
  this->KeyShift = false;
  this->KeyCtrl = false;
  this->KeyModsPrev = 0;
  this->KeyMods = 0;
  for (local_18 = 0; local_18 < 0x14; local_18 = local_18 + 1) {
    this->NavInputsDownDurationPrev[local_18] = -1.0;
    this->NavInputsDownDuration[local_18] = -1.0;
  }
  return;
}

Assistant:

void ImGuiIO::ClearInputKeys()
{
    memset(KeysDown, 0, sizeof(KeysDown));
    for (int n = 0; n < IM_ARRAYSIZE(KeysDownDuration); n++)
        KeysDownDuration[n] = KeysDownDurationPrev[n] = -1.0f;
    KeyCtrl = KeyShift = KeyAlt = KeySuper = false;
    KeyMods = KeyModsPrev = ImGuiKeyModFlags_None;
    for (int n = 0; n < IM_ARRAYSIZE(NavInputsDownDuration); n++)
        NavInputsDownDuration[n] = NavInputsDownDurationPrev[n] = -1.0f;
}